

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawenc.c
# Opt level: O3

void raw_write_image_file_or_md5
               (aom_image_t *img,int *planes,int num_planes,void *file_or_md5,WRITER writer_func)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  aom_img_fmt_t aVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined8 local_38;
  
  aVar4 = img->fmt;
  if (0 < num_planes) {
    uVar11 = 0;
    do {
      iVar6 = planes[uVar11];
      lVar8 = (long)iVar6;
      uVar5 = aom_img_plane_width(img,iVar6);
      iVar6 = aom_img_plane_height(img,iVar6);
      if ((lVar8 == 0) || (img->monochrome == 0)) {
        if (0 < iVar6) {
          iVar1 = img->stride[lVar8];
          puVar9 = img->planes[lVar8];
          do {
            (*writer_func)(file_or_md5,puVar9,2 - ((aVar4 & 0x800) == AOM_IMG_FMT_NONE),uVar5);
            puVar9 = puVar9 + iVar1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
      }
      else {
        bVar7 = 1;
        local_38 = _DAT_004cca40;
        if ((img->fmt & 0x800) != AOM_IMG_FMT_NONE) {
          auVar13 = ZEXT416((uint)(1 << ((char)img->bit_depth - 1U & 0x1f)));
          auVar13 = pshuflw(auVar13,auVar13,0);
          local_38 = auVar13._0_8_;
          bVar7 = 2;
        }
        lVar8 = (long)(int)(uint)(byte)(8 / bVar7);
        uVar2 = (long)(int)(iVar6 * uVar5) / lVar8;
        uVar3 = (long)(int)(iVar6 * uVar5) % lVar8;
        uVar12 = uVar3 & 0xffffffff;
        uVar10 = uVar2 & 0xffffffff;
        if (0 < (int)uVar2) {
          do {
            (*writer_func)(file_or_md5,(uint8_t *)&local_38,1,8);
            uVar5 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
        if (0 < (int)uVar3) {
          do {
            (*writer_func)(file_or_md5,(uint8_t *)&local_38,1,(uint)bVar7);
            uVar5 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)num_planes);
  }
  return;
}

Assistant:

static void raw_write_image_file_or_md5(const aom_image_t *img,
                                        const int *planes, const int num_planes,
                                        void *file_or_md5, WRITER writer_func) {
  const bool high_bitdepth = img->fmt & AOM_IMG_FMT_HIGHBITDEPTH;
  const int bytes_per_sample = high_bitdepth ? 2 : 1;
  for (int i = 0; i < num_planes; ++i) {
    const int plane = planes[i];
    const int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    // If we're on a color plane and the output is monochrome, write a greyscale
    // value. Since there are only YUV planes, compare against Y.
    if (img->monochrome && plane != AOM_PLANE_Y) {
      write_greyscale(img, w * h, writer_func, file_or_md5);
      continue;
    }
    const unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    for (int y = 0; y < h; ++y) {
      writer_func(file_or_md5, buf, bytes_per_sample, w);
      buf += stride;
    }
  }
}